

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  int numBitLevels;
  uint uVar2;
  UInt32 UVar3;
  long lVar4;
  long lVar5;
  long in_RDI;
  UInt32 i_1;
  UInt32 *distancesPrices;
  UInt32 *posSlotPrices;
  UInt16 *encoder;
  UInt32 posSlot_1;
  UInt32 base;
  UInt32 footerBits;
  UInt32 posSlot;
  UInt32 lenToPosState;
  UInt32 i;
  UInt32 tempPrices [128];
  uint local_23c;
  uint local_220;
  uint local_210;
  uint local_20c;
  UInt32 aUStack_1f8 [124];
  long local_8;
  
  local_8 = in_RDI;
  for (local_20c = 4; local_20c < 0x80; local_20c = local_20c + 1) {
    bVar1 = *(byte *)(local_8 + 0x304d4 + (ulong)local_20c);
    numBitLevels = (bVar1 >> 1) - 1;
    uVar2 = (bVar1 & 1 | 2) << ((byte)numBitLevels & 0x1f);
    UVar3 = RcTree_ReverseGetPrice
                      ((UInt16 *)(local_8 + (ulong)uVar2 * 2 + (ulong)(uint)bVar1 * -2 + 0x34146),
                       numBitLevels,local_20c - uVar2,(UInt32 *)(local_8 + 0x324d4));
    aUStack_1f8[(ulong)local_20c - 4] = UVar3;
  }
  for (local_210 = 0; local_210 < 4; local_210 = local_210 + 1) {
    lVar4 = local_8 + 0x33f48;
    lVar5 = local_8 + 0x32f84 + (ulong)local_210 * 0x100;
    for (local_220 = 0; local_220 < *(uint *)(local_8 + 0x33bc8); local_220 = local_220 + 1) {
      UVar3 = RcTree_GetPrice((UInt16 *)(lVar4 + (ulong)local_210 * 0x80),6,local_220,
                              (UInt32 *)(local_8 + 0x324d4));
      *(UInt32 *)(lVar5 + (ulong)local_220 * 4) = UVar3;
    }
    for (local_220 = 0xe; local_220 < *(uint *)(local_8 + 0x33bc8); local_220 = local_220 + 1) {
      *(uint *)(lVar5 + (ulong)local_220 * 4) =
           ((local_220 >> 1) - 5) * 0x10 + *(int *)(lVar5 + (ulong)local_220 * 4);
    }
    lVar4 = local_8 + 0x33384 + (ulong)local_210 * 0x200;
    for (local_23c = 0; local_23c < 4; local_23c = local_23c + 1) {
      *(undefined4 *)(lVar4 + (ulong)local_23c * 4) = *(undefined4 *)(lVar5 + (ulong)local_23c * 4);
    }
    for (; local_23c < 0x80; local_23c = local_23c + 1) {
      *(UInt32 *)(lVar4 + (ulong)local_23c * 4) =
           *(int *)(lVar5 + (ulong)*(byte *)(local_8 + 0x304d4 + (ulong)local_23c) * 4) +
           aUStack_1f8[(ulong)local_23c - 4];
    }
  }
  *(undefined4 *)(local_8 + 0x3d340) = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc* p) {
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++) {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++) {
    UInt32 posSlot;
    const CLzmaProb* encoder = p->posSlotEncoder[lenToPosState];
    UInt32* posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32* distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}